

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::ConfigFileNames
          (cmQtAutoGenInitializer *this,ConfigString *configString,string_view prefix,
          string_view suffix)

{
  string_view view;
  string_view view_00;
  bool bVar1;
  mapped_type *this_00;
  char *pcVar2;
  cmAlphaNum local_188;
  char *local_158;
  char *pcStack_150;
  cmAlphaNum local_148;
  string local_118;
  reference local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cfg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmAlphaNum local_c8;
  char *local_98;
  char *local_90;
  cmAlphaNum local_88;
  string local_58;
  ConfigString *local_38;
  ConfigString *configString_local;
  cmQtAutoGenInitializer *this_local;
  string_view suffix_local;
  string_view prefix_local;
  
  suffix_local._M_len = (size_t)suffix._M_str;
  this_local = (cmQtAutoGenInitializer *)suffix._M_len;
  pcVar2 = prefix._M_str;
  local_98 = (char *)prefix._M_len;
  local_90 = pcVar2;
  local_38 = configString;
  configString_local = (ConfigString *)this;
  suffix_local._M_str = local_98;
  cmAlphaNum::cmAlphaNum(&local_88,prefix);
  view_00._M_str = (char *)suffix_local._M_len;
  view_00._M_len = (size_t)this_local;
  cmAlphaNum::cmAlphaNum(&local_c8,view_00);
  cmStrCat<>(&local_58,&local_88,&local_c8);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((this->MultiConfig & 1U) != 0) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ConfigsList);
    cfg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->ConfigsList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cfg), bVar1) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      local_158 = suffix_local._M_str;
      view._M_str = pcVar2;
      view._M_len = (size_t)suffix_local._M_str;
      pcStack_150 = pcVar2;
      cmAlphaNum::cmAlphaNum(&local_148,view);
      cmAlphaNum::cmAlphaNum(&local_188,'_');
      cmStrCat<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                (&local_118,&local_148,&local_188,local_f8,
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_38->Config,local_f8);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNames(ConfigString& configString,
                                             cm::string_view prefix,
                                             cm::string_view suffix)
{
  configString.Default = cmStrCat(prefix, suffix);
  if (this->MultiConfig) {
    for (auto const& cfg : this->ConfigsList) {
      configString.Config[cfg] = cmStrCat(prefix, '_', cfg, suffix);
    }
  }
}